

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::SignedCastExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,SignedCastExpressionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  ParenthesizedExpressionSyntax *node;
  size_t index_local;
  SignedCastExpressionSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->signing).kind;
    token._2_1_ = (this->signing).field_0x2;
    token.numFlags.raw = (this->signing).numFlags.raw;
    token.rawLen = (this->signing).rawLen;
    token.info = (this->signing).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->apostrophe).kind;
    token_00._2_1_ = (this->apostrophe).field_0x2;
    token_00.numFlags.raw = (this->apostrophe).numFlags.raw;
    token_00.rawLen = (this->apostrophe).rawLen;
    token_00.info = (this->apostrophe).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    node = not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::get(&this->inner);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax SignedCastExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return signing;
        case 1: return apostrophe;
        case 2: return inner.get();
        default: return nullptr;
    }
}